

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

string * rcg::(anonymous_namespace)::getBufferString_abi_cxx11_
                   (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,
                   BUFFER_INFO_CMD cmd)

{
  GC_ERROR GVar1;
  element_type *peVar2;
  BUFFER_HANDLE in_RCX;
  DS_HANDLE in_RDX;
  string *in_RDI;
  BUFFER_INFO_CMD in_R8D;
  size_t size;
  char tmp [1024];
  INFO_DATATYPE type;
  string *ret;
  size_t local_440;
  char local_438 [1036];
  int local_2c;
  undefined1 local_25;
  BUFFER_INFO_CMD local_24;
  BUFFER_HANDLE local_20;
  DS_HANDLE local_18;
  
  local_25 = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI);
  memset(local_438,0,0x400);
  local_440 = 0x400;
  if ((local_18 != (DS_HANDLE)0x0) && (local_20 != (BUFFER_HANDLE)0x0)) {
    peVar2 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12bace);
    GVar1 = (*peVar2->DSGetBufferInfo)(local_18,local_20,local_24,&local_2c,local_438,&local_440);
    if ((GVar1 == 0) && (local_2c == 1)) {
      std::__cxx11::string::operator=(in_RDI,local_438);
    }
  }
  return in_RDI;
}

Assistant:

inline std::string getBufferString(const std::shared_ptr<const GenTLWrapper> &gentl,
                                   void *stream, void *buffer, GenTL::BUFFER_INFO_CMD cmd)
{
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t size=sizeof(tmp);

  if (stream != 0 && buffer != 0)
  {
    if (gentl->DSGetBufferInfo(stream, buffer, cmd, &type, &tmp, &size) == GenTL::GC_ERR_SUCCESS)
    {
      if (type == GenTL::INFO_DATATYPE_STRING)
      {
        ret=tmp;
      }
    }
  }

  return ret;
}